

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall TCPSocket::IOError::IOError(IOError *this,string *reason,int code)

{
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  int local_1c;
  string *psStack_18;
  int code_local;
  string *reason_local;
  IOError *this_local;
  
  local_1c = code;
  psStack_18 = reason;
  reason_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"IO exception",&local_61);
  std::operator+(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  TCPSocketError::TCPSocketError(&this->super_TCPSocketError,local_40,local_1c);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *(undefined ***)&this->super_TCPSocketError = &PTR__IOError_00242690;
  return;
}

Assistant:

IOError(std::string reason="", int code=0) : TCPSocketError(std::string("IO exception") + reason, code){}